

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_xformOps_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  ostream *poVar4;
  value *this_00;
  value_type *this_01;
  uint32_t indent_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint32_t n;
  OpType *op;
  long lVar6;
  undefined1 in_R8B;
  long lVar7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  string varname;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  printed_vars;
  value_type xformOp;
  optional<tinyusdz::value::Value> pv;
  optional<tinyusdz::value::TimeSamples> local_1e0;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  printed_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &printed_vars._M_t._M_impl.super__Rb_tree_header._M_header;
  printed_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  printed_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  printed_vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar6 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  printed_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       printed_vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (lVar2 != lVar6) {
    lVar7 = 0;
    uVar8 = 0;
    while( true ) {
      indent = 0x70;
      if ((ulong)((lVar2 - lVar6) / 0x70) <= uVar8) break;
      XformOp::XformOp(&xformOp,(XformOp *)(lVar6 + lVar7));
      if (xformOp.op_type != ResetXformStack) {
        to_string_abi_cxx11_(&varname,(tinyusdz *)&xformOp,op);
        if (xformOp.suffix._M_string_length != 0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv,
                           ":",&xformOp.suffix);
          ::std::__cxx11::string::append((string *)&varname);
          ::std::__cxx11::string::_M_dispose();
        }
        bVar1 = primvar::PrimVar::has_value(&xformOp._var);
        if (bVar1) {
          sVar3 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&printed_vars,&varname);
          if (sVar3 == 0) {
            pVar9 = ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&printed_vars,&varname);
            pprint::Indent_abi_cxx11_
                      ((string *)&pv,(pprint *)((ulong)xformOps & 0xffffffff),pVar9._8_4_);
            ::std::operator<<(local_1a8,(string *)&pv);
            ::std::__cxx11::string::_M_dispose();
            primvar::PrimVar::type_name_abi_cxx11_((string *)&pv,&xformOp._var);
            poVar4 = ::std::operator<<(local_1a8,(string *)&pv);
            ::std::operator<<(poVar4," ");
            ::std::__cxx11::string::_M_dispose();
            ::std::operator<<(local_1a8,(string *)&varname);
            ::std::operator<<(local_1a8," = ");
            bVar1 = XformOp::is_blocked(&xformOp);
            if (bVar1) {
              ::std::operator<<(local_1a8,"None");
            }
            else {
              XformOp::get_scalar((optional<tinyusdz::value::Value> *)&local_1e0,&xformOp);
              nonstd::optional_lite::optional<tinyusdz::value::Value>::
              optional<tinyusdz::value::Value,_0>
                        (&pv,(optional<tinyusdz::value::Value> *)&local_1e0);
              nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional
                        ((optional<tinyusdz::value::Value> *)&local_1e0);
              if (pv.has_value_ == true) {
                this_00 = (value *)nonstd::optional_lite::optional<tinyusdz::value::Value>::value
                                             (&pv);
                value::pprint_value_abi_cxx11_
                          ((string *)&local_1e0,this_00,(Value *)((ulong)xformOps & 0xffffffff),1,
                           (bool)in_R8B);
                ::std::operator<<(local_1a8,(string *)&local_1e0);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                ::std::operator<<(local_1a8,"[InternalError]");
              }
              nonstd::optional_lite::optional<tinyusdz::value::Value>::~optional(&pv);
            }
            ::std::operator<<(local_1a8,"\n");
            goto LAB_00230135;
          }
        }
        else {
LAB_00230135:
          if (xformOp._var._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              xformOp._var._ts._samples.
              super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&varname,".timeSamples");
            sVar3 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&printed_vars,(key_type *)&pv);
            ::std::__cxx11::string::_M_dispose();
            if (sVar3 == 0) {
              pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&varname
              ;
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&varname,".timeSamples");
              indent_00 = (uint32_t)pbVar5;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&printed_vars,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pv);
              ::std::__cxx11::string::_M_dispose();
              pprint::Indent_abi_cxx11_((string *)&pv,(pprint *)((ulong)xformOps & 0xffffffff),n);
              ::std::operator<<(local_1a8,(string *)&pv);
              ::std::__cxx11::string::_M_dispose();
              primvar::PrimVar::type_name_abi_cxx11_((string *)&pv,&xformOp._var);
              poVar4 = ::std::operator<<(local_1a8,(string *)&pv);
              ::std::operator<<(poVar4," ");
              ::std::__cxx11::string::_M_dispose();
              ::std::operator<<(local_1a8,(string *)&varname);
              ::std::operator<<(local_1a8,".timeSamples");
              ::std::operator<<(local_1a8," = ");
              XformOp::get_timesamples(&local_1e0,&xformOp);
              nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::
              optional<tinyusdz::value::TimeSamples,_0>
                        ((optional<tinyusdz::value::TimeSamples> *)&pv,&local_1e0);
              nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional(&local_1e0);
              if (pv.has_value_ == true) {
                this_01 = nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::value
                                    ((optional<tinyusdz::value::TimeSamples> *)&pv);
                print_timesamples_abi_cxx11_
                          ((string *)&local_1e0,(tinyusdz *)this_01,
                           (TimeSamples *)((ulong)xformOps & 0xffffffff),indent_00);
                ::std::operator<<(local_1a8,(string *)&local_1e0);
                ::std::__cxx11::string::_M_dispose();
              }
              else {
                ::std::operator<<(local_1a8,"[InternalError]");
              }
              nonstd::optional_lite::optional<tinyusdz::value::TimeSamples>::~optional
                        ((optional<tinyusdz::value::TimeSamples> *)&pv);
              ::std::operator<<(local_1a8,"\n");
            }
          }
        }
        ::std::__cxx11::string::_M_dispose();
      }
      XformOp::~XformOp(&xformOp);
      uVar8 = uVar8 + 1;
      lVar6 = *(long *)this;
      lVar2 = *(long *)(this + 8);
      lVar7 = lVar7 + 0x70;
    }
  }
  print_xformOpOrder_abi_cxx11_
            ((string *)&xformOp,this,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)
             ((ulong)xformOps & 0xffffffff),indent);
  ::std::operator<<(local_1a8,(string *)&xformOp);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&printed_vars._M_t);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_xformOps(const std::vector<XformOp> &xformOps,
                           const uint32_t indent) {
  std::stringstream ss;

  // To prevent printing xformOp attributes multiple times.
  std::set<std::string> printed_vars;

  // xforms props
  if (xformOps.size()) {
    for (size_t i = 0; i < xformOps.size(); i++) {
      const auto xformOp = xformOps[i];

      if (xformOp.op_type == XformOp::OpType::ResetXformStack) {
        // No need to print value.
        continue;
      }

      std::string varname = to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        varname += ":" + xformOp.suffix;
      }

      DCOUT("has_default " << xformOp.has_default());
      DCOUT("has_timesamples " << xformOp.has_timesamples());

      if (xformOp.has_default()) {
        if (printed_vars.count(varname)) {
          continue;
        }

        printed_vars.insert(varname);

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << " = ";

        if (xformOp.is_blocked()) {
          ss << "None";
        } else if (auto pv = xformOp.get_scalar()) {
          ss << value::pprint_value(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }

        // TODO: metadata
        ss << "\n";
      }

      if (xformOp.has_timesamples()) {

        if (printed_vars.count(varname + ".timeSamples")) {
          continue;
        }

        printed_vars.insert(varname + ".timeSamples");

        ss << pprint::Indent(indent);
        ss << xformOp.get_value_type_name() << " ";
        ss << varname;
        ss << ".timeSamples";
        ss << " = ";

        if (auto pv = xformOp.get_timesamples()) {
          ss << print_timesamples(pv.value(), indent);
        } else {
          ss << "[InternalError]";
        }
        ss << "\n";
      }

    }
  }

  // uniform token[] xformOpOrder
  ss << print_xformOpOrder(xformOps, indent);

  return ss.str();
}